

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::
     format<long,int,int,int,std::__cxx11::string,double,double,double,double,double,double,double,double,double,double,double,double,double,double,double>
               (ostream *out,char *fmt,long *args,int *args_1,int *args_2,int *args_3,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
               double *args_5,double *args_6,double *args_7,double *args_8,double *args_9,
               double *args_10,double *args_11,double *args_12,double *args_13,double *args_14,
               double *args_15,double *args_16,double *args_17,double *args_18,double *args_19)

{
  long lVar1;
  int *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long *in_R8;
  int *in_R9;
  long in_FS_OFFSET;
  FormatListRef in_stack_00000010;
  char *in_stack_00000018;
  ostream *in_stack_00000020;
  int local_228 [10];
  double *in_stack_fffffffffffffe00;
  double *in_stack_fffffffffffffe08;
  double *in_stack_fffffffffffffe10;
  double *in_stack_fffffffffffffe18;
  double *in_stack_fffffffffffffe20;
  double *in_stack_fffffffffffffe28;
  double *in_stack_fffffffffffffe30;
  double *in_stack_fffffffffffffe38;
  double *in_stack_fffffffffffffe40;
  double *in_stack_fffffffffffffe48;
  double *in_stack_fffffffffffffe50;
  double *in_stack_fffffffffffffe58;
  double *in_stack_fffffffffffffe60;
  double *in_stack_fffffffffffffe68;
  double *in_stack_fffffffffffffe70;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  makeFormatList<long,int,int,int,std::__cxx11::string,double,double,double,double,double,double,double,double,double,double,double,double,double,double,double>
            (in_R8,in_R9,local_228,in_RSI,in_RDI,in_stack_fffffffffffffe00,in_stack_fffffffffffffe08
             ,in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe28,in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
             in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe58,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68,
             in_stack_fffffffffffffe70);
  vformat(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}